

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::Storage::setApplicationArguments(Storage *this,int argc,char **argv)

{
  VRegistry *this_00;
  bool bVar1;
  int iVar2;
  CommandLineArgs *commandLineArgs;
  char *pcVar3;
  RegisteredLoggers *pRVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppVar5;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_true>
  local_b0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_true>
  local_a8;
  iterator it;
  string local_90;
  undefined1 local_70 [8];
  Configurations c;
  char **argv_local;
  int argc_local;
  Storage *this_local;
  
  c._72_8_ = argv;
  utils::CommandLineArgs::setArgs(&this->m_commandLineArgs,argc,argv);
  this_00 = this->m_vRegistry;
  commandLineArgs = Storage::commandLineArgs(this);
  VRegistry::setFromArgs(this_00,commandLineArgs);
  bVar1 = utils::CommandLineArgs::hasParamWithValue
                    (&this->m_commandLineArgs,consts::kDefaultLogFileParam);
  if (bVar1) {
    Configurations::Configurations((Configurations *)local_70);
    pcVar3 = utils::CommandLineArgs::getParamValue
                       (&this->m_commandLineArgs,consts::kDefaultLogFileParam);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_90,pcVar3,
               (allocator *)
               ((long)&it.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_true>
                       ._M_cur + 3));
    Configurations::setGlobally((Configurations *)local_70,Filename,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&it.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_true>
                       ._M_cur + 3));
    pRVar4 = registeredLoggers(this);
    RegisteredLoggers::setDefaultConfigurations(pRVar4,(Configurations *)local_70);
    pRVar4 = registeredLoggers(this);
    iVar2 = (*(pRVar4->
              super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).
              super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
              .super_ThreadSafe._vptr_ThreadSafe[5])();
    local_a8._M_cur = (__node_type *)CONCAT44(extraout_var,iVar2);
    while( true ) {
      pRVar4 = registeredLoggers(this);
      iVar2 = (*(pRVar4->
                super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).
                super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
                .super_ThreadSafe._vptr_ThreadSafe[6])();
      local_b0._M_cur = (__node_type *)CONCAT44(extraout_var_00,iVar2);
      bVar1 = utils::std::__detail::operator!=(&local_a8,&local_b0);
      if (!bVar1) break;
      ppVar5 = utils::std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_false,_true>
                             *)&local_a8);
      Logger::configure(ppVar5->second,(Configurations *)local_70);
      utils::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_false,_true>
                    *)&local_a8);
    }
    Configurations::~Configurations((Configurations *)local_70);
  }
  return;
}

Assistant:

void Storage::setApplicationArguments(int argc, char** argv) {
  m_commandLineArgs.setArgs(argc, argv);
  m_vRegistry->setFromArgs(commandLineArgs());
  // default log file
#if !defined(ELPP_DISABLE_LOG_FILE_FROM_ARG)
  if (m_commandLineArgs.hasParamWithValue(base::consts::kDefaultLogFileParam)) {
    Configurations c;
    c.setGlobally(ConfigurationType::Filename,
                  std::string(m_commandLineArgs.getParamValue(base::consts::kDefaultLogFileParam)));
    registeredLoggers()->setDefaultConfigurations(c);
    for (base::RegisteredLoggers::iterator it = registeredLoggers()->begin();
         it != registeredLoggers()->end(); ++it) {
      it->second->configure(c);
    }
  }
#endif  // !defined(ELPP_DISABLE_LOG_FILE_FROM_ARG)
#if defined(ELPP_LOGGING_FLAGS_FROM_ARG)
  if (m_commandLineArgs.hasParamWithValue(base::consts::kLoggingFlagsParam)) {
    int userInput = atoi(m_commandLineArgs.getParamValue(base::consts::kLoggingFlagsParam));
    if (ELPP_DEFAULT_LOGGING_FLAGS == 0x0) {
      m_flags = userInput;
    } else {
      base::utils::addFlag<base::type::EnumType>(userInput, &m_flags);
    }
  }
#endif  // defined(ELPP_LOGGING_FLAGS_FROM_ARG)
}